

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall SimpleLogger::LoggerStream::LoggerStream(LoggerStream *this)

{
  std::ios::ios((ios *)&this->field_0x220);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x182570;
  *(undefined8 *)&this->field_0x220 = 0x182598;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__001825b0);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x182570;
  *(undefined8 *)&this->field_0x220 = 0x182598;
  std::__cxx11::stringbuf::stringbuf((stringbuf *)&(this->super_ostream).field_0x8);
  std::__cxx11::stringstream::stringstream((stringstream *)&(this->super_ostream).field_0x70);
  this->level = 0;
  this->logger = (SimpleLogger *)0x0;
  this->file = (char *)0x0;
  this->func = (char *)0x0;
  this->line = 0;
  return;
}

Assistant:

LoggerStream() : std::ostream(&buf), level(0), logger(nullptr)
                       , file(nullptr), func(nullptr), line(0) {}